

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

Status __thiscall
wallet::BerkeleyROCursor::Next(BerkeleyROCursor *this,DataStream *ssKey,DataStream *ssValue)

{
  long lVar1;
  bool bVar2;
  size_t in_RCX;
  DataStream *in_RDX;
  DataStream *in_RSI;
  long in_FS_OFFSET;
  _Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
  *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  _Self *in_stack_ffffffffffffff98;
  int iVar3;
  undefined4 local_2c;
  undefined4 local_28;
  undefined8 local_20;
  undefined4 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::operator==(in_stack_ffffffffffffff98,
                          (_Self *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar2) {
    local_2c = DONE;
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
    ::operator->(in_stack_ffffffffffffff88);
    Span<std::byte_const>::Span<std::vector<std::byte,zero_after_free_allocator<std::byte>>>
              ((Span<const_std::byte> *)in_RSI,
               (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    DataStream::write(in_RSI,local_18,local_10,in_RCX);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
    ::operator->(in_stack_ffffffffffffff88);
    Span<std::byte_const>::Span<std::vector<std::byte,zero_after_free_allocator<std::byte>>>
              ((Span<const_std::byte> *)in_RSI,
               (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    iVar3 = (int)((ulong)in_RSI >> 0x20);
    DataStream::write(in_RDX,local_28,local_20,in_RCX);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
                  *)in_RDX,iVar3);
    local_2c = MORE;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

DatabaseCursor::Status BerkeleyROCursor::Next(DataStream& ssKey, DataStream& ssValue)
{
    if (m_cursor == m_cursor_end) {
        return DatabaseCursor::Status::DONE;
    }
    ssKey.write(Span(m_cursor->first));
    ssValue.write(Span(m_cursor->second));
    m_cursor++;
    return DatabaseCursor::Status::MORE;
}